

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O0

QTextTable * __thiscall QTextCursorPrivate::complexSelectionTable(QTextCursorPrivate *this)

{
  bool bVar1;
  long in_RDI;
  long in_FS_OFFSET;
  QTextTable *t;
  QTextTableCell cell_anchor;
  QTextTableCell cell_pos;
  QTextDocumentPrivate *in_stack_ffffffffffffffc0;
  QTextTable *local_30;
  undefined1 local_28 [16];
  QTextTable *local_18;
  int position;
  QTextTable *this_00;
  
  this_00 = *(QTextTable **)(in_FS_OFFSET + 0x28);
  if (*(int *)(in_RDI + 0x18) == *(int *)(in_RDI + 0x1c)) {
    local_30 = (QTextTable *)0x0;
  }
  else {
    QTextDocumentPrivate::frameAt(in_stack_ffffffffffffffc0,(int)((ulong)in_RDI >> 0x20));
    local_30 = qobject_cast<QTextTable*>((QObject *)0x79f944);
    if (local_30 != (QTextTable *)0x0) {
      local_18 = (QTextTable *)&DAT_aaaaaaaaaaaaaaaa;
      position = -0x55555556;
      QTextTable::cellAt(this_00,-0x55555556);
      local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextTable::cellAt(this_00,position);
      bVar1 = QTextTableCell::operator==((QTextTableCell *)&local_18,(QTextTableCell *)local_28);
      if (bVar1) {
        local_30 = (QTextTable *)0x0;
      }
      QTextTableCell::~QTextTableCell((QTextTableCell *)local_28);
      QTextTableCell::~QTextTableCell((QTextTableCell *)&local_18);
    }
  }
  if (*(QTextTable **)(in_FS_OFFSET + 0x28) != this_00) {
    __stack_chk_fail();
  }
  return local_30;
}

Assistant:

QTextTable *QTextCursorPrivate::complexSelectionTable() const
{
    if (position == anchor)
        return nullptr;

    QTextTable *t = qobject_cast<QTextTable *>(priv->frameAt(position));
    if (t) {
        QTextTableCell cell_pos = t->cellAt(position);
        QTextTableCell cell_anchor = t->cellAt(adjusted_anchor);

        Q_ASSERT(cell_anchor.isValid());

        if (cell_pos == cell_anchor)
            t = nullptr;
    }
    return t;
}